

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap.cpp
# Opt level: O0

ssize_t C_std::Write(int fd,void *buf,size_t count)

{
  ssize_t sVar1;
  int *piVar2;
  allocator local_49;
  string local_48 [36];
  int local_24;
  size_t sStack_20;
  int n;
  size_t count_local;
  void *buf_local;
  int fd_local;
  
  sStack_20 = count;
  count_local = (size_t)buf;
  buf_local._4_4_ = fd;
  do {
    sVar1 = write(buf_local._4_4_,(void *)count_local,sStack_20);
    local_24 = (int)sVar1;
    if (-1 < local_24) goto LAB_00104336;
    piVar2 = __errno_location();
  } while (((*piVar2 == 0xb) || (piVar2 = __errno_location(), *piVar2 == 0xb)) ||
          (piVar2 = __errno_location(), *piVar2 == 4));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"write error",&local_49);
  perror_exit((string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
LAB_00104336:
  return (long)local_24;
}

Assistant:

ssize_t Write(int fd, const void *buf, size_t count) {
        AGAIN:
        int n = write(fd, buf, count);
        if (n < 0) {
            //出错处理
            if (errno == EAGAIN || errno == EWOULDBLOCK) {
                goto AGAIN;
            } else if (errno == EINTR) {
                //慢速系统调用，如果被注册捕捉函数的信号中断则重新读取
                goto AGAIN;
            } else {
                perror_exit("write error");
            }
        }
        return n;
    }